

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  bool bVar1;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func;
  Type *extraout_RDX_01;
  int local_1b0;
  bool local_1aa;
  bool local_1a9;
  bool _kj_shouldLog_2;
  undefined1 *puStack_1a8;
  bool _kj_shouldLog_1;
  Maybe<kj::Exception> local_1a0;
  int local_30;
  bool local_29;
  undefined1 local_28 [7];
  bool _kj_shouldLog;
  Array<kj::(anonymous_namespace)::TestObject> array;
  TestCase135 *this_local;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  array.disposer = (ArrayDisposer *)this;
  heapArray<kj::(anonymous_namespace)::TestObject>
            ((Array<kj::(anonymous_namespace)::TestObject> *)local_28,0x20);
  func = extraout_RDX;
  if ((anonymous_namespace)::TestObject::count != 0x20) {
    local_29 = _::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (local_29 != false) {
      local_30 = 0x20;
      _::Debug::log<char_const(&)[45],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x8c,ERROR,
                 "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
                 (char (*) [45])"failed: expected (32) == (TestObject::count)",&local_30,
                 &(anonymous_namespace)::TestObject::count);
      func = extraout_RDX_01;
      local_29 = false;
    }
  }
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  puStack_1a8 = local_28;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase135::run()::__0>
            (&local_1a0,(kj *)&stack0xfffffffffffffe58,func);
  bVar1 = Maybe<kj::Exception>::operator!=(&local_1a0,(void *)0x0);
  Maybe<kj::Exception>::~Maybe(&local_1a0);
  if (!bVar1) {
    local_1a9 = _::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      _::Debug::log<char_const(&)[84]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { array = nullptr; }) != nullptr\""
                 ,(char (*) [84])
                  "failed: expected ::kj::runCatchingExceptions([&]() { array = nullptr; }) != nullptr"
                );
      local_1a9 = false;
    }
  }
  if ((anonymous_namespace)::TestObject::count != 0) {
    local_1aa = _::Debug::shouldLog(ERROR);
    while (local_1aa != false) {
      local_1b0 = 0;
      _::Debug::log<char_const(&)[44],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x91,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
                 (char (*) [44])"failed: expected (0) == (TestObject::count)",&local_1b0,
                 &(anonymous_namespace)::TestObject::count);
      local_1aa = false;
    }
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST(Array, ThrowingDestructor) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array = heapArray<TestObject>(32);
  EXPECT_EQ(32, TestObject::count);

  // If a destructor throws, all elements should still be destroyed.
  TestObject::throwAt = 16;
  EXPECT_ANY_THROW(array = nullptr);
  EXPECT_EQ(0, TestObject::count);
}